

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_AES.cpp
# Opt level: O0

AESEncContext * __thiscall ASDCP::AESEncContext::InitKey(AESEncContext *this,byte_t *key)

{
  int iVar1;
  ILogSink *this_00;
  h__AESContext *phVar2;
  byte_t *userKey;
  byte_t *in_RDX;
  byte_t *key_local;
  AESEncContext *this_local;
  
  if (in_RDX == (byte_t *)0x0) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (this_00,"NULL pointer in file %s, line %d\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_AES.cpp"
               ,0x4a);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
  }
  else {
    phVar2 = ASDCP::mem_ptr::operator_cast_to_h__AESContext_((mem_ptr *)key);
    if (phVar2 == (h__AESContext *)0x0) {
      phVar2 = (h__AESContext *)operator_new(0x128);
      h__AESContext::h__AESContext(phVar2);
      mem_ptr<ASDCP::AESEncContext::h__AESContext>::operator=
                ((mem_ptr<ASDCP::AESEncContext::h__AESContext> *)key,phVar2);
      phVar2 = mem_ptr<ASDCP::AESEncContext::h__AESContext>::operator->
                         ((mem_ptr<ASDCP::AESEncContext::h__AESContext> *)key);
      Kumu::Identifier<16U>::Set(&(phVar2->m_KeyBuf).super_Identifier<16U>,in_RDX);
      phVar2 = mem_ptr<ASDCP::AESEncContext::h__AESContext>::operator->
                         ((mem_ptr<ASDCP::AESEncContext::h__AESContext> *)key);
      userKey = Kumu::Identifier<16U>::Value(&(phVar2->m_KeyBuf).super_Identifier<16U>);
      phVar2 = ASDCP::mem_ptr::operator_cast_to_h__AESContext_((mem_ptr *)key);
      iVar1 = AES_set_encrypt_key(userKey,0x80,(AES_KEY *)phVar2);
      if (iVar1 == 0) {
        Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
      }
      else {
        print_ssl_error();
        Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_CRYPT_INIT);
      }
    }
    else {
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_INIT);
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::AESEncContext::InitKey(const byte_t* key)
{
  KM_TEST_NULL_L(key);

  if ( m_Context )
    return RESULT_INIT;

  m_Context = new h__AESContext;
  m_Context->m_KeyBuf.Set(key);

  if ( AES_set_encrypt_key(m_Context->m_KeyBuf.Value(), KEY_SIZE_BITS, m_Context) )
    {
      print_ssl_error();
      return RESULT_CRYPT_INIT;
    }

  return RESULT_OK;
}